

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

void brotli::RandomSample<brotli::Histogram<704>,unsigned_short>
               (uint *seed,unsigned_short *data,size_t length,size_t stride,Histogram<704> *sample)

{
  ulong uVar1;
  
  if (stride < length) {
    uVar1 = 1;
    if (*seed != 0) {
      uVar1 = (ulong)(*seed * 0x41a7);
    }
    *seed = (uint)uVar1;
    uVar1 = uVar1 % ((length - stride) + 1);
  }
  else {
    uVar1 = 0;
    stride = length;
  }
  Histogram<704>::Add<unsigned_short>(sample,data + uVar1,stride);
  return;
}

Assistant:

void RandomSample(unsigned int* seed,
                  const DataType* data,
                  size_t length,
                  size_t stride,
                  HistogramType* sample) {
  size_t pos = 0;
  if (stride >= length) {
    pos = 0;
    stride = length;
  } else {
    pos = MyRand(seed) % (length - stride + 1);
  }
  sample->Add(data + pos, stride);
}